

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int renameEditSql(sqlite3_context *pCtx,RenameCtx *pRename,char *zSql,char *zNew,int bQuote)

{
  sqlite3 *db;
  RenameToken *pRVar1;
  byte *pbVar2;
  uint uVar3;
  RenameCtx *pRVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  char *__s;
  char *z;
  char *__src;
  uint uVar8;
  RenameToken *pBest;
  RenameToken *p;
  int iVar9;
  RenameCtx *pRVar10;
  ulong local_68;
  
  local_68 = 0;
  uVar8 = 0;
  if (zNew != (char *)0x0) {
    sVar7 = strlen(zNew);
    uVar8 = (uint)sVar7 & 0x3fffffff;
  }
  if (zSql != (char *)0x0) {
    sVar7 = strlen(zSql);
    local_68 = (ulong)((uint)sVar7 & 0x3fffffff);
  }
  db = pCtx->pOut->db;
  __s = sqlite3MPrintf(db,"\"%w\"",zNew);
  if (__s == (char *)0x0) {
    iVar9 = 7;
  }
  else {
    sVar7 = strlen(__s);
    uVar5 = (uint)sVar7 & 0x3fffffff;
    if (bQuote != 0) {
      zNew = __s;
      uVar8 = uVar5;
    }
    z = (char *)sqlite3DbMallocZero(db,(long)(int)((int)local_68 + pRename->nList * uVar5 + 1));
    if (z == (char *)0x0) {
      iVar9 = 7;
    }
    else {
      memcpy(z,zSql,local_68);
      p = pRename->pList;
      while (p != (RenameToken *)0x0) {
        for (pRVar1 = p->pNext; pRVar4 = pRename, pRVar1 != (RenameToken *)0x0;
            pRVar1 = pRVar1->pNext) {
          if ((p->t).z < (pRVar1->t).z) {
            p = pRVar1;
          }
        }
        do {
          pRVar10 = pRVar4;
          pRVar1 = pRVar10->pList;
          pRVar4 = (RenameCtx *)&pRVar1->pNext;
        } while (pRVar1 != p);
        pRVar10->pList = p->pNext;
        pbVar2 = (byte *)(p->t).z;
        __src = zNew;
        uVar3 = uVar8;
        if ((""[*pbVar2] & 0x46) == 0) {
          __src = __s;
          uVar3 = uVar5;
        }
        iVar9 = (int)pbVar2 - (int)zSql;
        uVar6 = (p->t).n;
        if (uVar6 != uVar3) {
          uVar6 = uVar6 + iVar9;
          memmove(z + (uVar3 + iVar9),z + uVar6,(ulong)((int)local_68 - uVar6));
          uVar6 = (int)local_68 + (uVar3 - (p->t).n);
          local_68 = (ulong)uVar6;
          z[(int)uVar6] = '\0';
        }
        memcpy(z + iVar9,__src,(ulong)uVar3);
        sqlite3DbFreeNN(db,p);
        p = pRename->pList;
      }
      setResultStrOrError(pCtx,z,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3DbFreeNN(db,z);
      iVar9 = 0;
    }
    sqlite3_free(__s);
  }
  return iVar9;
}

Assistant:

static int renameEditSql(
  sqlite3_context *pCtx,          /* Return result here */
  RenameCtx *pRename,             /* Rename context */
  const char *zSql,               /* SQL statement to edit */
  const char *zNew,               /* New token text */
  int bQuote                      /* True to always quote token */
){
  int nNew = sqlite3Strlen30(zNew);
  int nSql = sqlite3Strlen30(zSql);
  sqlite3 *db = sqlite3_context_db_handle(pCtx);
  int rc = SQLITE_OK;
  char *zQuot;
  char *zOut;
  int nQuot;

  /* Set zQuot to point to a buffer containing a quoted copy of the 
  ** identifier zNew. If the corresponding identifier in the original 
  ** ALTER TABLE statement was quoted (bQuote==1), then set zNew to
  ** point to zQuot so that all substitutions are made using the
  ** quoted version of the new column name.  */
  zQuot = sqlite3MPrintf(db, "\"%w\"", zNew);
  if( zQuot==0 ){
    return SQLITE_NOMEM;
  }else{
    nQuot = sqlite3Strlen30(zQuot);
  }
  if( bQuote ){
    zNew = zQuot;
    nNew = nQuot;
  }

  /* At this point pRename->pList contains a list of RenameToken objects
  ** corresponding to all tokens in the input SQL that must be replaced
  ** with the new column name. All that remains is to construct and
  ** return the edited SQL string. */
  assert( nQuot>=nNew );
  zOut = sqlite3DbMallocZero(db, nSql + pRename->nList*nQuot + 1);
  if( zOut ){
    int nOut = nSql;
    memcpy(zOut, zSql, nSql);
    while( pRename->pList ){
      int iOff;                   /* Offset of token to replace in zOut */
      RenameToken *pBest = renameColumnTokenNext(pRename);

      u32 nReplace;
      const char *zReplace;
      if( sqlite3IsIdChar(*pBest->t.z) ){
        nReplace = nNew;
        zReplace = zNew;
      }else{
        nReplace = nQuot;
        zReplace = zQuot;
      }

      iOff = pBest->t.z - zSql;
      if( pBest->t.n!=nReplace ){
        memmove(&zOut[iOff + nReplace], &zOut[iOff + pBest->t.n], 
            nOut - (iOff + pBest->t.n)
        );
        nOut += nReplace - pBest->t.n;
        zOut[nOut] = '\0';
      }
      memcpy(&zOut[iOff], zReplace, nReplace);
      sqlite3DbFree(db, pBest);
    }

    sqlite3_result_text(pCtx, zOut, -1, SQLITE_TRANSIENT);
    sqlite3DbFree(db, zOut);
  }else{
    rc = SQLITE_NOMEM;
  }

  sqlite3_free(zQuot);
  return rc;
}